

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
          (HeapTypeGeneratorImpl *this,Field super)

{
  Field FVar1;
  uintptr_t uVar2;
  bool bVar3;
  Type TVar4;
  HeapTypeGeneratorImpl *this_local;
  Field super_local;
  uintptr_t local_10;
  
  this_local = (HeapTypeGeneratorImpl *)super.type.id;
  super_local.type.id._4_4_ = super.mutable_;
  TVar4.id = (uintptr_t)this_local;
  uVar2 = super._8_8_;
  if (super_local.type.id._4_4_ != Mutable) {
    super_local.type.id = super._8_8_;
    bVar3 = Field::isPacked((Field *)&this_local);
    if (bVar3) {
      super_local._8_8_ = this_local;
      local_10 = super_local.type.id;
      TVar4.id = super_local._8_8_;
      uVar2 = local_10;
    }
    else {
      TVar4 = generateSubtype(this,(Type)this_local);
      Field::Field((Field *)&super_local.packedType,TVar4,Immutable);
      TVar4.id = super_local._8_8_;
      uVar2 = local_10;
    }
  }
  local_10 = uVar2;
  super_local._8_8_ = TVar4.id;
  FVar1.packedType = (undefined4)local_10;
  FVar1.mutable_ = local_10._4_4_;
  FVar1.type.id._0_4_ = super_local.packedType;
  FVar1.type.id._4_4_ = super_local.mutable_;
  return FVar1;
}

Assistant:

Field generateSubField(Field super) {
    if (super.mutable_ == Mutable) {
      // Only immutable fields support subtyping.
      return super;
    }
    if (super.isPacked()) {
      // No other subtypes of i8 or i16.
      return super;
    }
    return {generateSubtype(super.type), Immutable};
  }